

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__read(uv_stream_t *stream)

{
  code *pcVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  uv_buf_t uVar8;
  ssize_t buflen;
  char *local_190;
  int is_ipc;
  int err;
  int count;
  char cmsg_space [272];
  undefined1 local_60 [8];
  msghdr msg;
  ssize_t nread;
  uv_buf_t buf;
  uv_stream_t *stream_local;
  
  stream->flags = stream->flags & 0xfffffeff;
  is_ipc = 0x20;
  bVar6 = false;
  buf.len = (size_t)stream;
  if (stream->type == UV_NAMED_PIPE) {
    bVar6 = *(int *)&stream[1].data != 0;
  }
  while( true ) {
    bVar7 = false;
    if ((*(long *)(buf.len + 0x70) != 0) && (bVar7 = false, (*(uint *)(buf.len + 0x58) & 4) != 0)) {
      bVar7 = 0 < is_ipc;
      is_ipc = is_ipc + -1;
    }
    if (!bVar7) {
      return;
    }
    if (*(long *)(buf.len + 0x68) == 0) {
      __assert_fail("stream->alloc_cb != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x46c,"void uv__read(uv_stream_t *)");
    }
    uVar8 = uv_buf_init((char *)0x0,0);
    buflen = (ssize_t)uVar8.base;
    nread = buflen;
    local_190 = (char *)uVar8.len;
    buf.base = local_190;
    (**(code **)(buf.len + 0x68))(buf.len,0x10000,&nread);
    if ((nread == 0) || (buf.base == (char *)0x0)) {
      (**(code **)(buf.len + 0x70))(buf.len,0xffffffffffffff97,&nread);
      return;
    }
    if (nread == 0) {
      __assert_fail("buf.base != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x476,"void uv__read(uv_stream_t *)");
    }
    if (*(int *)(buf.len + 0xb8) < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x477,"void uv__read(uv_stream_t *)");
    }
    if (bVar6) {
      msg.msg_controllen._0_4_ = 0;
      msg._8_8_ = &nread;
      msg.msg_iov = (iovec *)0x1;
      local_60 = (undefined1  [8])0x0;
      msg.msg_name._0_4_ = 0;
      msg.msg_control = (void *)0x110;
      msg.msg_iovlen = (size_t)&err;
      do {
        msg._48_8_ = uv__recvmsg(*(int *)(buf.len + 0xb8),(msghdr *)local_60,0);
        bVar7 = false;
        if ((long)msg._48_8_ < 0) {
          piVar5 = __errno_location();
          bVar7 = *piVar5 == 4;
        }
      } while (bVar7);
    }
    else {
      do {
        msg._48_8_ = read(*(int *)(buf.len + 0xb8),(void *)nread,(size_t)buf.base);
        bVar7 = false;
        if ((long)msg._48_8_ < 0) {
          piVar5 = __errno_location();
          bVar7 = *piVar5 == 4;
        }
      } while (bVar7);
    }
    pcVar2 = buf.base;
    if ((long)msg._48_8_ < 0) {
      piVar5 = __errno_location();
      if ((*piVar5 != 0xb) && (piVar5 = __errno_location(), sVar3 = buf.len, *piVar5 != 0xb)) {
        pcVar1 = *(code **)(buf.len + 0x70);
        piVar5 = __errno_location();
        (*pcVar1)(sVar3,(long)-*piVar5,&nread,-*piVar5);
        if ((*(uint *)(buf.len + 0x58) & 4) == 0) {
          return;
        }
        *(uint *)(buf.len + 0x58) = *(uint *)(buf.len + 0x58) & 0xfffffffb;
        uv__io_stop(*(uv_loop_t **)(buf.len + 8),(uv__io_t *)(buf.len + 0x88),1);
        iVar4 = uv__io_active((uv__io_t *)(buf.len + 0x88),4);
        if (((iVar4 == 0) && ((*(uint *)(buf.len + 0x58) & 0x4000) != 0)) &&
           (*(uint *)(buf.len + 0x58) = *(uint *)(buf.len + 0x58) & 0xffffbfff,
           (*(uint *)(buf.len + 0x58) & 0x2000) != 0)) {
          *(int *)(*(long *)(buf.len + 8) + 8) = *(int *)(*(long *)(buf.len + 8) + 8) + -1;
        }
        uv__stream_osx_interrupt_select((uv_stream_t *)buf.len);
        return;
      }
      if ((*(uint *)(buf.len + 0x58) & 4) != 0) {
        uv__io_start(*(uv_loop_t **)(buf.len + 8),(uv__io_t *)(buf.len + 0x88),1);
        uv__stream_osx_interrupt_select((uv_stream_t *)buf.len);
      }
      (**(code **)(buf.len + 0x70))(buf.len,0,&nread);
      return;
    }
    if (msg._48_8_ == 0) {
      uv__stream_eof((uv_stream_t *)buf.len,(uv_buf_t *)&nread);
      return;
    }
    if ((bVar6) &&
       (iVar4 = uv__stream_recv_cmsg((uv_stream_t *)buf.len,(msghdr *)local_60), iVar4 != 0)) break;
    (**(code **)(buf.len + 0x70))(buf.len,msg._48_8_,&nread);
    if ((long)msg._48_8_ < (long)pcVar2) {
      *(uint *)(buf.len + 0x58) = *(uint *)(buf.len + 0x58) | 0x100;
      return;
    }
  }
  (**(code **)(buf.len + 0x70))(buf.len,(long)iVar4,&nread);
  return;
}

Assistant:

static void uv__read(uv_stream_t* stream) {
  uv_buf_t buf;
  ssize_t nread;
  struct msghdr msg;
  char cmsg_space[CMSG_SPACE(UV__CMSG_FD_SIZE)];
  int count;
  int err;
  int is_ipc;

  stream->flags &= ~UV_STREAM_READ_PARTIAL;

  /* Prevent loop starvation when the data comes in as fast as (or faster than)
   * we can read it. XXX Need to rearm fd if we switch to edge-triggered I/O.
   */
  count = 32;

  is_ipc = stream->type == UV_NAMED_PIPE && ((uv_pipe_t*) stream)->ipc;

  /* XXX: Maybe instead of having UV_STREAM_READING we just test if
   * tcp->read_cb is NULL or not?
   */
  while (stream->read_cb
      && (stream->flags & UV_STREAM_READING)
      && (count-- > 0)) {
    assert(stream->alloc_cb != NULL);

    buf = uv_buf_init(NULL, 0);
    stream->alloc_cb((uv_handle_t*)stream, 64 * 1024, &buf);
    if (buf.base == NULL || buf.len == 0) {
      /* User indicates it can't or won't handle the read. */
      stream->read_cb(stream, UV_ENOBUFS, &buf);
      return;
    }

    assert(buf.base != NULL);
    assert(uv__stream_fd(stream) >= 0);

    if (!is_ipc) {
      do {
        nread = read(uv__stream_fd(stream), buf.base, buf.len);
      }
      while (nread < 0 && errno == EINTR);
    } else {
      /* ipc uses recvmsg */
      msg.msg_flags = 0;
      msg.msg_iov = (struct iovec*) &buf;
      msg.msg_iovlen = 1;
      msg.msg_name = NULL;
      msg.msg_namelen = 0;
      /* Set up to receive a descriptor even if one isn't in the message */
      msg.msg_controllen = sizeof(cmsg_space);
      msg.msg_control = cmsg_space;

      do {
        nread = uv__recvmsg(uv__stream_fd(stream), &msg, 0);
      }
      while (nread < 0 && errno == EINTR);
    }

    if (nread < 0) {
      /* Error */
      if (errno == EAGAIN || errno == EWOULDBLOCK) {
        /* Wait for the next one. */
        if (stream->flags & UV_STREAM_READING) {
          uv__io_start(stream->loop, &stream->io_watcher, POLLIN);
          uv__stream_osx_interrupt_select(stream);
        }
        stream->read_cb(stream, 0, &buf);
#if defined(__CYGWIN__) || defined(__MSYS__)
      } else if (errno == ECONNRESET && stream->type == UV_NAMED_PIPE) {
        uv__stream_eof(stream, &buf);
        return;
#endif
      } else {
        /* Error. User should call uv_close(). */
        stream->read_cb(stream, -errno, &buf);
        if (stream->flags & UV_STREAM_READING) {
          stream->flags &= ~UV_STREAM_READING;
          uv__io_stop(stream->loop, &stream->io_watcher, POLLIN);
          if (!uv__io_active(&stream->io_watcher, POLLOUT))
            uv__handle_stop(stream);
          uv__stream_osx_interrupt_select(stream);
        }
      }
      return;
    } else if (nread == 0) {
      uv__stream_eof(stream, &buf);
      return;
    } else {
      /* Successful read */
      ssize_t buflen = buf.len;

      if (is_ipc) {
        err = uv__stream_recv_cmsg(stream, &msg);
        if (err != 0) {
          stream->read_cb(stream, err, &buf);
          return;
        }
      }

#if defined(__MVS__)
      if (is_ipc && msg.msg_controllen > 0) {
        uv_buf_t blankbuf;
        int nread;
        struct iovec *old;

        blankbuf.base = 0;
        blankbuf.len = 0;
        old = msg.msg_iov;
        msg.msg_iov = (struct iovec*) &blankbuf;
        nread = 0;
        do {
          nread = uv__recvmsg(uv__stream_fd(stream), &msg, 0);
          err = uv__stream_recv_cmsg(stream, &msg);
          if (err != 0) {
            stream->read_cb(stream, err, &buf);
            msg.msg_iov = old;
            return;
          }
        } while (nread == 0 && msg.msg_controllen > 0);
        msg.msg_iov = old;
      }
#endif
      stream->read_cb(stream, nread, &buf);

      /* Return if we didn't fill the buffer, there is no more data to read. */
      if (nread < buflen) {
        stream->flags |= UV_STREAM_READ_PARTIAL;
        return;
      }
    }
  }
}